

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamReader_p.cpp
# Opt level: O3

bool __thiscall BamTools::Internal::BamReaderPrivate::Seek(BamReaderPrivate *this,int64_t *position)

{
  bool bVar1;
  string message;
  string streamError;
  string local_88 [2];
  string local_48;
  
  bVar1 = BgzfStream::IsOpen(&this->m_stream);
  if (bVar1) {
    bVar1 = true;
    BgzfStream::Seek(&this->m_stream,position);
  }
  else {
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"BamReader::Seek","");
    local_88[0]._M_dataplus._M_p = (pointer)&local_88[0].field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_88,"cannot seek on unopened BAM file","");
    SetErrorString(this,&local_48,local_88);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88[0]._M_dataplus._M_p != &local_88[0].field_2) {
      operator_delete(local_88[0]._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p);
    }
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool BamReaderPrivate::Seek(const int64_t& position)
{

    // skip if BAM file not open
    if (!IsOpen()) {
        SetErrorString("BamReader::Seek", "cannot seek on unopened BAM file");
        return false;
    }

    try {
        m_stream.Seek(position);
        return true;
    } catch (const BamException& e) {
        const std::string streamError = e.what();
        const std::string message = std::string("could not seek in BAM file: \n\t") + streamError;
        SetErrorString("BamReader::Seek", message);
        return false;
    }
}